

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximp.cpp
# Opt level: O3

UChar32 __thiscall icu_63::CaseFoldingUTextIterator::next(CaseFoldingUTextIterator *this)

{
  UChar **pString;
  UChar UVar1;
  UChar UVar2;
  int iVar3;
  UText *ut;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  UChar *pUVar7;
  int32_t iVar8;
  uint uVar9;
  
  pString = &this->fFoldChars;
  pUVar7 = this->fFoldChars;
  if (pUVar7 == (UChar *)0x0) {
    ut = this->fUText;
    iVar3 = ut->chunkOffset;
    if ((iVar3 < ut->chunkLength) &&
       (uVar5 = (uint)(ushort)ut->chunkContents[iVar3], (ushort)ut->chunkContents[iVar3] < 0xd800))
    {
      ut->chunkOffset = iVar3 + 1;
    }
    else {
      uVar5 = utext_next32_63(ut);
      if (uVar5 == 0xffffffff) {
        return -1;
      }
    }
    iVar8 = 0;
    uVar5 = ucase_toFullFolding_63(uVar5,pString,0);
    this->fFoldLength = uVar5;
    if (0x1e < uVar5) {
      if ((int)uVar5 < 0) {
        uVar5 = ~uVar5;
        this->fFoldLength = uVar5;
      }
      goto LAB_0016ecc5;
    }
    pUVar7 = *pString;
  }
  else {
    uVar5 = this->fFoldLength;
    iVar8 = this->fFoldIndex;
  }
  uVar9 = iVar8 + 1;
  this->fFoldIndex = uVar9;
  UVar1 = pUVar7[iVar8];
  uVar6 = (uint)(ushort)UVar1;
  if ((((UVar1 & 0xfc00U) == 0xd800) && (uVar9 != uVar5)) &&
     (UVar2 = pUVar7[(int)uVar9], ((ushort)UVar2 & 0xfc00) == 0xdc00)) {
    uVar9 = iVar8 + 2;
    this->fFoldIndex = uVar9;
    uVar6 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
  }
  bVar4 = (int)uVar9 < (int)uVar5;
  uVar5 = uVar6;
  if (bVar4) {
    return uVar6;
  }
LAB_0016ecc5:
  *pString = (UChar *)0x0;
  return uVar5;
}

Assistant:

UChar32 CaseFoldingUTextIterator::next() {
    UChar32  foldedC;
    UChar32  originalC;
    if (fFoldChars == NULL) {
        // We are not in a string folding of an earlier character.
        // Start handling the next char from the input UText.
        originalC = UTEXT_NEXT32(&fUText);
        if (originalC == U_SENTINEL) {
            return originalC;
        }
        fFoldLength = ucase_toFullFolding(originalC, &fFoldChars, U_FOLD_CASE_DEFAULT);
        if (fFoldLength >= UCASE_MAX_STRING_LENGTH || fFoldLength < 0) {
            // input code point folds to a single code point, possibly itself.
            // See comment in ucase.h for explanation of return values from ucase_toFullFoldings.
            if (fFoldLength < 0) {
                fFoldLength = ~fFoldLength;
            }
            foldedC = (UChar32)fFoldLength;
            fFoldChars = NULL;
            return foldedC;
        }
        // String foldings fall through here.
        fFoldIndex = 0;
    }

    U16_NEXT(fFoldChars, fFoldIndex, fFoldLength, foldedC);
    if (fFoldIndex >= fFoldLength) {
        fFoldChars = NULL;
    }
    return foldedC;
}